

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QCss::StyleRule>::relocate
          (QArrayDataPointer<QCss::StyleRule> *this,qsizetype offset,StyleRule **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QCss::StyleRule> *in_RDI;
  StyleRule **unaff_retaddr;
  StyleRule *res;
  StyleRule *first;
  QArrayDataPointer<QCss::StyleRule> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QCss::StyleRule,long_long>
            (first,(longlong)in_RDI,(StyleRule *)0x48b3e4);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QCss::StyleRule>,QCss::StyleRule_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x38 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }